

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O3

Tim_Man_t * Tim_ManReduce(Tim_Man_t *p,Vec_Int_t *vBoxesLeft,int nTermsDiff)

{
  uint uVar1;
  Tim_Obj_t *pTVar2;
  Tim_Obj_t *pTVar3;
  float *pfVar4;
  void *pvVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Tim_Man_t *p_00;
  Vec_Ptr_t *pVVar12;
  void **ppvVar13;
  float *pfVar14;
  Vec_Ptr_t *pVVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  if ((p->vBoxes == (Vec_Ptr_t *)0x0) || (p->vBoxes->nSize == 0)) {
    iVar8 = p->nCis;
  }
  else {
    iVar8 = Tim_ManBoxOutputFirst(p,0);
  }
  iVar9 = Tim_ManPoNum(p);
  auVar7 = _DAT_007ee2e0;
  uVar21 = vBoxesLeft->nSize;
  pVVar15 = p->vBoxes;
  if (pVVar15 == (Vec_Ptr_t *)0x0) {
    iVar19 = 0;
  }
  else {
    iVar19 = pVVar15->nSize;
  }
  if (iVar19 < (int)uVar21) {
    __assert_fail("Vec_IntSize(vBoxesLeft) <= Tim_ManBoxNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                  ,0x107,"Tim_Man_t *Tim_ManReduce(Tim_Man_t *, Vec_Int_t *, int)");
  }
  iVar8 = iVar8 - nTermsDiff;
  iVar9 = iVar9 - nTermsDiff;
  iVar19 = iVar8;
  iVar20 = iVar9;
  if (0 < (int)uVar21) {
    uVar18 = 0;
    do {
      iVar10 = vBoxesLeft->pArray[uVar18];
      if (((long)iVar10 < 0) || (pVVar15->nSize <= iVar10)) goto LAB_0041d61e;
      iVar19 = iVar19 + *(int *)((long)pVVar15->pArray[iVar10] + 0xc);
      iVar20 = iVar20 + *(int *)((long)pVVar15->pArray[iVar10] + 8);
      uVar18 = uVar18 + 1;
    } while (uVar21 != uVar18);
  }
  uVar21 = p->nCis;
  if ((int)(uVar21 - nTermsDiff) < iVar19) {
    __assert_fail("nNewCis <= Tim_ManCiNum(p) - nTermsDiff",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                  ,0x111,"Tim_Man_t *Tim_ManReduce(Tim_Man_t *, Vec_Int_t *, int)");
  }
  uVar1 = p->nCos;
  if ((int)(uVar1 - nTermsDiff) < iVar20) {
    __assert_fail("nNewCos <= Tim_ManCoNum(p) - nTermsDiff",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                  ,0x112,"Tim_Man_t *Tim_ManReduce(Tim_Man_t *, Vec_Int_t *, int)");
  }
  if ((0 < (int)uVar21) && (pTVar2 = p->pCis, pTVar2 != (Tim_Obj_t *)0x0)) {
    lVar16 = (ulong)uVar21 - 1;
    auVar22._8_4_ = (int)lVar16;
    auVar22._0_8_ = lVar16;
    auVar22._12_4_ = (int)((ulong)lVar16 >> 0x20);
    lVar16 = 0;
    auVar22 = auVar22 ^ _DAT_007ee2e0;
    auVar28 = _DAT_007ee2c0;
    auVar25 = _DAT_007ee2d0;
    do {
      auVar27 = auVar25 ^ auVar7;
      iVar10 = auVar22._4_4_;
      if ((bool)(~(auVar27._4_4_ == iVar10 && auVar22._0_4_ < auVar27._0_4_ ||
                  iVar10 < auVar27._4_4_) & 1)) {
        *(undefined4 *)((long)&pTVar2->TravId + lVar16) = 0;
      }
      if ((auVar27._12_4_ != auVar22._12_4_ || auVar27._8_4_ <= auVar22._8_4_) &&
          auVar27._12_4_ <= auVar22._12_4_) {
        *(undefined4 *)((long)&pTVar2[1].TravId + lVar16) = 0;
      }
      auVar27 = auVar28 ^ auVar7;
      iVar11 = auVar27._4_4_;
      if (iVar11 <= iVar10 && (iVar11 != iVar10 || auVar27._0_4_ <= auVar22._0_4_)) {
        *(undefined4 *)((long)&pTVar2[2].TravId + lVar16) = 0;
        *(undefined4 *)((long)&pTVar2[3].TravId + lVar16) = 0;
      }
      lVar24 = auVar25._8_8_;
      auVar25._0_8_ = auVar25._0_8_ + 4;
      auVar25._8_8_ = lVar24 + 4;
      lVar24 = auVar28._8_8_;
      auVar28._0_8_ = auVar28._0_8_ + 4;
      auVar28._8_8_ = lVar24 + 4;
      lVar16 = lVar16 + 0x60;
    } while ((ulong)(uVar21 + 3 >> 2) * 0x60 != lVar16);
  }
  auVar7 = _DAT_007ee2e0;
  if ((0 < (int)uVar1) && (pTVar2 = p->pCos, pTVar2 != (Tim_Obj_t *)0x0)) {
    lVar16 = (ulong)uVar1 - 1;
    auVar23._8_4_ = (int)lVar16;
    auVar23._0_8_ = lVar16;
    auVar23._12_4_ = (int)((ulong)lVar16 >> 0x20);
    lVar16 = 0;
    auVar23 = auVar23 ^ _DAT_007ee2e0;
    auVar27 = _DAT_007ee2c0;
    auVar26 = _DAT_007ee2d0;
    do {
      auVar28 = auVar26 ^ auVar7;
      iVar10 = auVar23._4_4_;
      if ((bool)(~(auVar28._4_4_ == iVar10 && auVar23._0_4_ < auVar28._0_4_ ||
                  iVar10 < auVar28._4_4_) & 1)) {
        *(undefined4 *)((long)&pTVar2->TravId + lVar16) = 0;
      }
      if ((auVar28._12_4_ != auVar23._12_4_ || auVar28._8_4_ <= auVar23._8_4_) &&
          auVar28._12_4_ <= auVar23._12_4_) {
        *(undefined4 *)((long)&pTVar2[1].TravId + lVar16) = 0;
      }
      auVar28 = auVar27 ^ auVar7;
      iVar11 = auVar28._4_4_;
      if (iVar11 <= iVar10 && (iVar11 != iVar10 || auVar28._0_4_ <= auVar23._0_4_)) {
        *(undefined4 *)((long)&pTVar2[2].TravId + lVar16) = 0;
        *(undefined4 *)((long)&pTVar2[3].TravId + lVar16) = 0;
      }
      lVar24 = auVar26._8_8_;
      auVar26._0_8_ = auVar26._0_8_ + 4;
      auVar26._8_8_ = lVar24 + 4;
      lVar24 = auVar27._8_8_;
      auVar27._0_8_ = auVar27._0_8_ + 4;
      auVar27._8_8_ = lVar24 + 4;
      lVar16 = lVar16 + 0x60;
    } while ((ulong)(uVar1 + 3 >> 2) * 0x60 != lVar16);
  }
  p_00 = Tim_ManStart(iVar19,iVar20);
  memcpy(p_00->pCis,p->pCis,(long)iVar8 * 0x18);
  pTVar2 = p_00->pCos;
  iVar19 = p->nCos;
  pTVar3 = p->pCos;
  iVar10 = Tim_ManPoNum(p);
  memcpy(pTVar2 + ((long)iVar20 - (long)iVar9),pTVar3 + ((long)iVar19 - (long)iVar10),
         (long)iVar9 * 0x18);
  pVVar15 = p->vDelayTables;
  if (pVVar15 != (Vec_Ptr_t *)0x0) {
    uVar21 = pVVar15->nSize;
    if (0 < (long)(int)uVar21) {
      pVVar12 = (Vec_Ptr_t *)malloc(0x10);
      uVar18 = 8;
      if (8 < uVar21) {
        uVar18 = (ulong)uVar21;
      }
      pVVar12->nCap = (int)uVar18;
      ppvVar13 = (void **)malloc(uVar18 << 3);
      pVVar12->pArray = ppvVar13;
      pVVar12->nSize = uVar21;
      bVar6 = false;
      memset(ppvVar13,0,(long)(int)uVar21 << 3);
      p_00->vDelayTables = pVVar12;
      if (0 < pVVar15->nSize) {
        uVar18 = 0;
        do {
          pfVar4 = (float *)pVVar15->pArray[uVar18];
          if (pfVar4 != (float *)0x0) {
            if (!bVar6 && uVar18 != (uint)(int)*pfVar4) {
              puts("Warning: Mismatch in delay-table number between the manager and the box.");
              bVar6 = true;
            }
            uVar21 = (int)(float)((ulong)*(undefined8 *)(pfVar4 + 1) >> 0x20) *
                     (int)(float)*(undefined8 *)(pfVar4 + 1);
            pfVar14 = (float *)malloc((long)(int)uVar21 * 4 + 0xc);
            *pfVar14 = (float)(int)uVar18;
            pfVar14[1] = (float)(int)pfVar4[1];
            pfVar14[2] = (float)(int)pfVar4[2];
            if (0 < (int)uVar21) {
              uVar17 = 0;
              do {
                pfVar14[uVar17 + 3] = pfVar4[uVar17 + 3];
                uVar17 = uVar17 + 1;
              } while (uVar21 != uVar17);
            }
            if ((long)pVVar12->nSize <= (long)uVar18) goto LAB_0041d61e;
            if (pVVar12->pArray[uVar18] != (void *)0x0) {
              __assert_fail("Vec_PtrEntry(pNew->vDelayTables, i) == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                            ,0x137,"Tim_Man_t *Tim_ManReduce(Tim_Man_t *, Vec_Int_t *, int)");
            }
            pVVar12->pArray[uVar18] = pfVar14;
            pVVar15 = p->vDelayTables;
          }
          uVar18 = uVar18 + 1;
        } while ((long)uVar18 < (long)pVVar15->nSize);
      }
    }
  }
  if ((p->vBoxes != (Vec_Ptr_t *)0x0) && (uVar21 = p->vBoxes->nSize, 0 < (int)uVar21)) {
    pVVar15 = (Vec_Ptr_t *)malloc(0x10);
    uVar18 = 8;
    if (8 < uVar21) {
      uVar18 = (ulong)uVar21;
    }
    pVVar15->nSize = 0;
    pVVar15->nCap = (int)uVar18;
    ppvVar13 = (void **)malloc(uVar18 << 3);
    pVVar15->pArray = ppvVar13;
    p_00->vBoxes = pVVar15;
    if (vBoxesLeft->nSize < 1) {
      iVar19 = 0;
    }
    else {
      lVar16 = 0;
      iVar19 = 0;
      do {
        iVar20 = vBoxesLeft->pArray[lVar16];
        if (((long)iVar20 < 0) || (p->vBoxes->nSize <= iVar20)) {
LAB_0041d61e:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar5 = p->vBoxes->pArray[iVar20];
        Tim_ManCreateBox(p_00,iVar19,*(int *)((long)pvVar5 + 8),iVar8,*(int *)((long)pvVar5 + 0xc),
                         *(int *)((long)pvVar5 + 0x10),*(int *)((long)pvVar5 + 0x18));
        if (p_00->vBoxes == (Vec_Ptr_t *)0x0) {
          iVar10 = -1;
        }
        else {
          iVar10 = p_00->vBoxes->nSize + -1;
        }
        iVar11 = Tim_ManBoxCopy(p,iVar20);
        if (iVar11 != -1) {
          iVar20 = Tim_ManBoxCopy(p,iVar20);
        }
        Tim_ManBoxSetCopy(p_00,iVar10,iVar20);
        iVar8 = iVar8 + *(int *)((long)pvVar5 + 0xc);
        iVar19 = iVar19 + *(int *)((long)pvVar5 + 8);
        lVar16 = lVar16 + 1;
      } while (lVar16 < vBoxesLeft->nSize);
    }
    if (iVar8 != p_00->nCis) {
      __assert_fail("curPi == Tim_ManCiNum(pNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                    ,0x14a,"Tim_Man_t *Tim_ManReduce(Tim_Man_t *, Vec_Int_t *, int)");
    }
    if (iVar19 + iVar9 != p_00->nCos) {
      __assert_fail("curPo == Tim_ManCoNum(pNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                    ,0x14b,"Tim_Man_t *Tim_ManReduce(Tim_Man_t *, Vec_Int_t *, int)");
    }
  }
  return p_00;
}

Assistant:

Tim_Man_t * Tim_ManReduce( Tim_Man_t * p, Vec_Int_t * vBoxesLeft, int nTermsDiff )
{
    Tim_Man_t * pNew;
    Tim_Box_t * pBox;
    Tim_Obj_t * pObj;
    float * pDelayTable, * pDelayTableNew;
    int i, k, iBox, nNewCis, nNewCos, nInputs, nOutputs;
    int nNewPiNum = Tim_ManPiNum(p) - nTermsDiff;
    int nNewPoNum = Tim_ManPoNum(p) - nTermsDiff;
    assert( Vec_IntSize(vBoxesLeft) <= Tim_ManBoxNum(p) );
    // count the number of CIs and COs in the trimmed manager
    nNewCis = nNewPiNum;
    nNewCos = nNewPoNum;
    Vec_IntForEachEntry( vBoxesLeft, iBox, i )
    {
        pBox = Tim_ManBox( p, iBox );
        nNewCis += pBox->nOutputs;
        nNewCos += pBox->nInputs;
    }
    assert( nNewCis <= Tim_ManCiNum(p) - nTermsDiff );
    assert( nNewCos <= Tim_ManCoNum(p) - nTermsDiff );
    // clear traversal IDs
    Tim_ManForEachCi( p, pObj, i ) 
        pObj->TravId = 0;          
    Tim_ManForEachCo( p, pObj, i ) 
        pObj->TravId = 0;          
    // create new manager
    pNew = Tim_ManStart( nNewCis, nNewCos );
    // copy box connectivity information
    memcpy( pNew->pCis, p->pCis, sizeof(Tim_Obj_t) * nNewPiNum );
    memcpy( pNew->pCos + nNewCos - nNewPoNum, 
            p->pCos + Tim_ManCoNum(p) - Tim_ManPoNum(p), 
            sizeof(Tim_Obj_t) * nNewPoNum );
    // duplicate delay tables
    if ( Tim_ManDelayTableNum(p) > 0 )
    {
        int fWarning = 0;
        pNew->vDelayTables = Vec_PtrStart( Vec_PtrSize(p->vDelayTables) );
        Tim_ManForEachTable( p, pDelayTable, i )
        {
            if ( pDelayTable == NULL )
                continue;
            if ( i != (int)pDelayTable[0] && fWarning == 0 )
            {
                printf( "Warning: Mismatch in delay-table number between the manager and the box.\n" );
                fWarning = 1;
            }
            //assert( i == (int)pDelayTable[0] );
            nInputs   = (int)pDelayTable[1];
            nOutputs  = (int)pDelayTable[2];
            pDelayTableNew = ABC_ALLOC( float, 3 + nInputs * nOutputs );
            pDelayTableNew[0] = i;//(int)pDelayTable[0];
            pDelayTableNew[1] = (int)pDelayTable[1];
            pDelayTableNew[2] = (int)pDelayTable[2];
            for ( k = 0; k < nInputs * nOutputs; k++ )
                pDelayTableNew[3+k] = pDelayTable[3+k];
//            assert( (int)pDelayTableNew[0] == Vec_PtrSize(pNew->vDelayTables) );
            assert( Vec_PtrEntry(pNew->vDelayTables, i) == NULL );
            Vec_PtrWriteEntry( pNew->vDelayTables, i, pDelayTableNew );
        }
    }
    // duplicate boxes
    if ( Tim_ManBoxNum(p) > 0 )
    {
        int curPi = nNewPiNum;
        int curPo = 0;
        pNew->vBoxes = Vec_PtrAlloc( Tim_ManBoxNum(p) );
        Vec_IntForEachEntry( vBoxesLeft, iBox, i )
        {
            pBox = Tim_ManBox( p, iBox );
            Tim_ManCreateBox( pNew, curPo, pBox->nInputs, curPi, pBox->nOutputs, pBox->iDelayTable, pBox->fBlack );
            Tim_ManBoxSetCopy( pNew, Tim_ManBoxNum(pNew) - 1, Tim_ManBoxCopy(p, iBox) == -1 ? iBox : Tim_ManBoxCopy(p, iBox) );
            curPi += pBox->nOutputs;
            curPo += pBox->nInputs;
        }
        curPo += nNewPoNum;
        assert( curPi == Tim_ManCiNum(pNew) );
        assert( curPo == Tim_ManCoNum(pNew) );
    }
    return pNew;
}